

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynModuleImport * ParseImport(ParseContext *ctx)

{
  uint uVar1;
  LexemeType LVar2;
  char *pcVar3;
  IntrusiveList<SynIdentifier> parts;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ByteCode *bCode;
  SynModuleImport *this;
  Lexeme *pLVar7;
  IntrusiveList<SynIdentifier> path;
  IntrusiveList<SynIdentifier> local_68;
  Lexeme *local_50;
  SynIdentifier *local_48;
  SynIdentifier *pSStack_40;
  SynIdentifier *pSVar6;
  undefined4 extraout_var_01;
  
  local_50 = ctx->currentLexeme;
  if (local_50->type == lex_import) {
    ctx->currentLexeme = local_50 + 1;
    local_68.head = (SynIdentifier *)0x0;
    local_68.tail = (SynIdentifier *)0x0;
    bVar4 = anon_unknown.dwarf_169315::CheckAt(ctx,lex_string,"ERROR: name expected after import");
    if (bVar4) {
      pLVar7 = ctx->currentLexeme;
      pcVar3 = pLVar7->pos;
      uVar1 = pLVar7->length;
      if (pLVar7->type != lex_none) {
        ctx->currentLexeme = pLVar7 + 1;
      }
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar6 = (SynIdentifier *)CONCAT44(extraout_var,iVar5);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021cafb;
      pLVar7 = ctx->currentLexeme + -1;
      SynBase::SynBase((SynBase *)pSVar6,4,pLVar7,pLVar7);
      (pSVar6->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      (pSVar6->name).begin = pcVar3;
      (pSVar6->name).end = pcVar3 + uVar1;
      IntrusiveList<SynIdentifier>::push_back(&local_68,pSVar6);
    }
    pLVar7 = ctx->currentLexeme;
    LVar2 = pLVar7->type;
    while (LVar2 == lex_point) {
      ctx->currentLexeme = pLVar7 + 1;
      bVar4 = anon_unknown.dwarf_169315::CheckAt(ctx,lex_string,"ERROR: name expected after \'.\'");
      if (bVar4) {
        pLVar7 = ctx->currentLexeme;
        pcVar3 = pLVar7->pos;
        uVar1 = pLVar7->length;
        if (pLVar7->type != lex_none) {
          ctx->currentLexeme = pLVar7 + 1;
        }
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
        pSVar6 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar5);
        if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021cafb;
        pLVar7 = ctx->currentLexeme + -1;
        SynBase::SynBase((SynBase *)pSVar6,4,pLVar7,pLVar7);
        (pSVar6->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
        (pSVar6->name).begin = pcVar3;
        (pSVar6->name).end = pcVar3 + uVar1;
        IntrusiveList<SynIdentifier>::push_back(&local_68,pSVar6);
      }
      pLVar7 = ctx->currentLexeme;
      LVar2 = pLVar7->type;
    }
    anon_unknown.dwarf_169315::CheckConsume
              (ctx,lex_semicolon,"ERROR: \';\' not found after import expression");
    pLVar7 = local_50;
    parts.tail = local_68.tail;
    parts.head = local_68.head;
    bCode = (ByteCode *)GetBytecodeFromPath(ctx,local_50,parts);
    if (bCode != (ByteCode *)0x0) {
      ImportModuleNamespaces(ctx,pLVar7,bCode);
      uVar1 = (ctx->activeImports).count;
      if (uVar1 == 0) {
        __assert_fail("count > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x183,"void SmallArray<InplaceStr, 8>::pop_back() [T = InplaceStr, N = 8]");
      }
      (ctx->activeImports).count = uVar1 - 1;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
      this = (SynModuleImport *)CONCAT44(extraout_var_01,iVar5);
      if (ctx->firstLexeme < ctx->currentLexeme) {
        local_48 = local_68.head;
        pSStack_40 = local_68.tail;
        SynBase::SynBase((SynBase *)this,0x42,local_50,ctx->currentLexeme + -1);
        (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e81b0;
        (this->path).head = local_48;
        (this->path).tail = pSStack_40;
        this->bytecode = bCode;
        return this;
      }
LAB_0021cafb:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
  }
  return (SynModuleImport *)0x0;
}

Assistant:

SynModuleImport* ParseImport(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_import))
	{
		IntrusiveList<SynIdentifier> path;

		if(CheckAt(ctx, lex_string, "ERROR: name expected after import"))
		{
			InplaceStr value = ctx.Consume();
			path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
		}

		while(ctx.Consume(lex_point))
		{
			if(CheckAt(ctx, lex_string, "ERROR: name expected after '.'"))
			{
				InplaceStr value = ctx.Consume();
				path.push_back(new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), value));
			}
		}

		CheckConsume(ctx, lex_semicolon, "ERROR: ';' not found after import expression");

		if(const char *binary = GetBytecodeFromPath(ctx, start, path))
		{
			ImportModuleNamespaces(ctx, start, (ByteCode*)binary);

			ctx.activeImports.pop_back();

			return new (ctx.get<SynModuleImport>()) SynModuleImport(start, ctx.Previous(), path, (ByteCode*)binary);
		}
	}

	return NULL;
}